

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

void __thiscall Diligent::DeviceObjectArchive::Clear(DeviceObjectArchive *this)

{
  long lVar1;
  array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  local_b8;
  
  std::
  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)this);
  lVar1 = 0;
  do {
    *(undefined8 *)
     ((long)&local_b8._M_elems[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar1) = 0;
    *(undefined8 *)
     ((long)&local_b8._M_elems[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar1) = 0;
    *(undefined8 *)
     ((long)&local_b8._M_elems[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_finish + lVar1) = 0;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xa8);
  std::array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  ::operator=(&this->m_DeviceShaders,&local_b8);
  std::array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  ::~array(&local_b8);
  RefCntAutoPtr<Diligent::IDataBlob>::Release(&this->m_pArchiveData);
  this->m_ContentVersion = 0;
  return;
}

Assistant:

void DeviceObjectArchive::Clear() noexcept
{
    m_NamedResources.clear();
    m_DeviceShaders = {};
    m_pArchiveData.Release();
    m_ContentVersion = 0;
}